

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O0

string * __thiscall
wabt::Decompile_abi_cxx11_
          (string *__return_storage_ptr__,wabt *this,Module *module,DecompileOptions *options)

{
  undefined1 local_a0 [8];
  Decompiler decompiler;
  DecompileOptions *options_local;
  Module *module_local;
  
  decompiler.lst.vars._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)module;
  Decompiler::Decompiler((Decompiler *)local_a0,(Module *)this,(DecompileOptions *)module);
  Decompiler::Decompile_abi_cxx11_(__return_storage_ptr__,(Decompiler *)local_a0);
  Decompiler::~Decompiler((Decompiler *)local_a0);
  return __return_storage_ptr__;
}

Assistant:

std::string Decompile(const Module& module, const DecompileOptions& options) {
  Decompiler decompiler(module, options);
  return decompiler.Decompile();
}